

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconmor.cpp
# Opt level: O3

void __thiscall CVmConsole::show_con_more_prompt(CVmConsole *this)

{
  int iVar1;
  os_event_info_t evt;
  os_event_info_t local_110;
  
  (*this->disp_str_->_vptr_CVmFormatter[8])();
  (*this->disp_str_->_vptr_CVmFormatter[9])();
LAB_0023e337:
  while (iVar1 = os_get_event(0,0,&local_110), iVar1 != 1) {
    if (iVar1 == 5) {
      G_os_moremode = 0;
LAB_0023e390:
      (*this->disp_str_->_vptr_CVmFormatter[8])(this->disp_str_,"\r      \r");
      (*this->disp_str_->_vptr_CVmFormatter[2])(this->disp_str_,0);
      return;
    }
  }
  if (local_110.key[0] < 0x20) {
    if ((local_110.key[0] != 10) && (local_110.key[0] != 0xd)) goto LAB_0023e337;
  }
  else {
    if (local_110.key[0] == 0x20) goto LAB_0023e390;
    if (local_110.key[0] != 0x2028) goto LAB_0023e337;
  }
  (*this->disp_str_->_vptr_CVmFormatter[8])(this->disp_str_,"\r      \r");
  return;
}

Assistant:

void CVmConsole::show_con_more_prompt(VMG0_)
{
    int done;
    int next_page;

    /* display the "MORE" prompt */
    disp_str_->print_to_os("[More]");
    disp_str_->flush_to_os();

    /* wait for an acceptable keystroke */
    for (done = FALSE ; !done ; )
    {
        os_event_info_t evt;

        /* get an event */
        switch(os_get_event(0, FALSE, &evt))
        {
        case OS_EVT_KEY:
            switch(evt.key[0])
            {
            case ' ':
                /* stop waiting, show one page */
                done = TRUE;
                next_page = TRUE;
                break;

            case '\r':
            case '\n':
            case 0x2028:                /* unicode line separator character */
                /* stop waiting, show one line */
                done = TRUE;
                next_page = FALSE;
                break;

            default:
                /* ignore any other keystrokes */
                break;
            }
            break;

        case OS_EVT_EOF:
            /* end of file - there's nothing to wait for now */
            done = TRUE;
            next_page = TRUE;

            /* stop showing [more] prompts, as the user can't respond */
            G_os_moremode = FALSE;
            break;

        default:
            /* ignore other events */
            break;
        }
    }

    /* 
     *   Remove the prompt from the screen by backing up and overwriting
     *   it with spaces.  (Note that this assumes that we're running in
     *   some kind of terminal or character mode with a fixed-pitch font;
     *   if that's not the case, the OS layer should be taking
     *   responsibility for pagination anyway, so this code shouldn't be
     *   in use in the first place.)  
     */
    disp_str_->print_to_os( "\r      \r" );

    /* 
     *   if they pressed the space key, it means that we should show an
     *   entire new page, so reset the line count to zero; otherwise,
     *   we'll want to display another MORE prompt at the very next line,
     *   so leave the line count alone 
     */
    if (next_page)
        disp_str_->reset_line_count(FALSE);
}